

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdblookup.c
# Opt level: O0

int benchmark(MMDB_s *mmdb,int iterations)

{
  FILE *__stream;
  int error_code;
  clock_t cVar1;
  char *pcVar2;
  clock_t cVar3;
  double dVar4;
  double seconds;
  MMDB_entry_data_list_s *pMStack_68;
  int status;
  MMDB_entry_data_list_s *entry_data_list;
  MMDB_lookup_result_s result;
  int i;
  clock_t time;
  char local_28 [4];
  int exit_code;
  char ip_address [16];
  int iterations_local;
  MMDB_s *mmdb_local;
  
  time._4_4_ = 0;
  ip_address._12_4_ = iterations;
  cVar1 = clock();
  result._28_4_ = 0;
  do {
    if ((int)ip_address._12_4_ <= (int)result._28_4_) {
      cVar3 = clock();
      dVar4 = (double)(cVar3 - cVar1) / 1000000.0;
      fprintf(_stdout,"\n  Looked up %i addresses in %.2f seconds. %.2f lookups per second.\n\n",
              dVar4,(double)(int)ip_address._12_4_ / dVar4,(ulong)(uint)ip_address._12_4_);
LAB_0010353c:
      MMDB_close(mmdb);
      return time._4_4_;
    }
    random_ipv4(local_28);
    lookup_or_die((MMDB_lookup_result_s *)&entry_data_list,mmdb,local_28);
    pMStack_68 = (MMDB_entry_data_list_s *)0x0;
    if ((((byte)entry_data_list & 1) != 0) &&
       (error_code = MMDB_get_entry_data_list((MMDB_entry_s *)&result,&stack0xffffffffffffff98),
       __stream = _stderr, error_code != 0)) {
      pcVar2 = MMDB_strerror(error_code);
      fprintf(__stream,"Got an error looking up the entry data - %s\n",pcVar2);
      time._4_4_ = 5;
      MMDB_free_entry_data_list(pMStack_68);
      goto LAB_0010353c;
    }
    MMDB_free_entry_data_list(pMStack_68);
    result._28_4_ = result._28_4_ + 1;
  } while( true );
}

Assistant:

static int benchmark(MMDB_s *mmdb, int iterations) {
    char ip_address[16];
    int exit_code = 0;

    clock_t time = clock();

    for (int i = 0; i < iterations; i++) {
        random_ipv4(ip_address);

        MMDB_lookup_result_s result = lookup_or_die(mmdb, ip_address);
        MMDB_entry_data_list_s *entry_data_list = NULL;

        if (result.found_entry) {

            int status =
                MMDB_get_entry_data_list(&result.entry, &entry_data_list);

            if (MMDB_SUCCESS != status) {
                fprintf(stderr,
                        "Got an error looking up the entry data - %s\n",
                        MMDB_strerror(status));
                exit_code = 5;
                MMDB_free_entry_data_list(entry_data_list);
                goto end;
            }
        }

        MMDB_free_entry_data_list(entry_data_list);
    }

    time = clock() - time;
    double seconds = ((double)time / CLOCKS_PER_SEC);
    fprintf(stdout,
            "\n  Looked up %i addresses in %.2f seconds. %.2f lookups per "
            "second.\n\n",
            iterations,
            seconds,
            iterations / seconds);

end:
    MMDB_close(mmdb);

    return exit_code;
}